

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O3

ulint __thiscall
bwtil::WaveletTree::recursiveRank(WaveletTree *this,uchar c,ulint i,ulint node,uint level)

{
  pointer psVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  psVar1 = (this->nodes).
           super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = node * 0x60;
  uVar8 = psVar1[node].n;
  if (uVar8 != 0) {
    uVar5 = ~level + this->log_sigma;
    do {
      uVar4 = i >> 6;
      bVar3 = (byte)i & 0x3f;
      if ((c >> (uVar5 & 0x1f) & 1) == 0) {
        if (uVar8 == i) {
          lVar6 = *(long *)((long)&psVar1->global_rank1 + lVar6);
        }
        else {
          if ((i & 0x3f) == 0) {
            lVar7 = 0;
          }
          else {
            lVar7 = POPCOUNT(*(ulong *)(*(long *)((long)&(psVar1->bitvector).
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + lVar6) + uVar4 * 8) >>
                             ((ulong)(byte)-bVar3 & 0x3f));
          }
          lVar6 = lVar7 + *(long *)(*(long *)((long)&(psVar1->rank_ptrs_1).
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + lVar6) + (i >> 0xc) * 8) +
                  (ulong)*(ushort *)
                          (*(long *)((long)&(psVar1->rank_ptrs_2).
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl + lVar6) + uVar4 * 2);
        }
        uVar8 = i - lVar6;
        uVar2 = (uint)uVar8;
        if (uVar5 == 0) goto LAB_00106e0b;
        node = node * 2 + 1;
      }
      else {
        if (uVar8 == i) {
          uVar8 = (ulong)*(uint *)((long)&psVar1->global_rank1 + lVar6);
        }
        else {
          if ((i & 0x3f) == 0) {
            lVar7 = 0;
          }
          else {
            lVar7 = POPCOUNT(*(ulong *)(*(long *)((long)&(psVar1->bitvector).
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + lVar6) + uVar4 * 8) >>
                             ((ulong)(byte)-bVar3 & 0x3f));
          }
          uVar8 = lVar7 + *(long *)(*(long *)((long)&(psVar1->rank_ptrs_1).
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + lVar6) + (i >> 0xc) * 8) +
                  (ulong)*(ushort *)
                          (*(long *)((long)&(psVar1->rank_ptrs_2).
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl + lVar6) + uVar4 * 2);
        }
        uVar2 = (uint)uVar8;
        if (uVar5 == 0) {
LAB_00106e0b:
          return uVar8 & 0xffffffff;
        }
        node = node * 2 + 2;
      }
      uVar5 = uVar5 - 1;
      i = (ulint)uVar2;
      lVar6 = node * 0x60;
      uVar8 = psVar1[node].n;
    } while (uVar8 != 0);
  }
  return 0;
}

Assistant:

ulint recursiveRank(uchar c, ulint i, ulint node, uint level){//number of characters 'c' before position i excluded

		if(nodes[node].length()==0)//empty node
			return 0;

		uint bit = bitInChar(c,level);
		uint rank;

		if(bit==0)
			rank = nodes[node].rank0(i);
		else
			rank = nodes[node].rank1(i);

		if(level==log_sigma-1)//leaf
			return rank;

		//not a leaf: proceed recursively

		return recursiveRank(c, rank, (bit==0?child0(node):child1(node)), level+1);

	}